

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_LogicalAndExprPrecedence_Test::~ExprWriterTest_LogicalAndExprPrecedence_Test
          (ExprWriterTest_LogicalAndExprPrecedence_Test *this)

{
  ExprWriterTest::~ExprWriterTest((ExprWriterTest *)&this[-1].super_ExprWriterTest.l0);
  return;
}

Assistant:

TEST_F(ExprWriterTest, LogicalAndExprPrecedence) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  CHECK_WRITE("if 0 && 1 && 1 then 1",
      MakeIf(MakeBinaryLogical(ex::AND, MakeBinaryLogical(ex::AND, l0, l1), l1),
          n1, n0));
  CHECK_WRITE("if 0 && (1 && 1) then 1",
      MakeIf(MakeBinaryLogical(ex::AND, l0, MakeBinaryLogical(ex::AND, l1, l1)),
          n1, n0));
  CHECK_WRITE("if 0 <= 1 && 1 then 1",
      MakeIf(MakeBinaryLogical(ex::AND,
                               MakeRelational(ex::LE, n0, n1), l1), n1, n0));
}